

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to_string_converters.h
# Opt level: O0

string * __thiscall
common::vector_to_string_abi_cxx11_
          (string *__return_storage_ptr__,common *this,
          vector<join::JoinResultElement,_std::allocator<join::JoinResultElement>_> *v)

{
  bool bVar1;
  iterator iVar2;
  iterator iVar3;
  reference pJVar4;
  long __val;
  string local_188;
  string local_168;
  string local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined8 uStack_58;
  JoinResultElement e;
  iterator __end1;
  iterator __begin1;
  vector<join::JoinResultElement,_std::allocator<join::JoinResultElement>_> *__range1;
  vector<join::JoinResultElement,_std::allocator<join::JoinResultElement>_> *v_local;
  string *s;
  
  iVar2 = std::vector<join::JoinResultElement,_std::allocator<join::JoinResultElement>_>::begin
                    ((vector<join::JoinResultElement,_std::allocator<join::JoinResultElement>_> *)
                     this);
  iVar3 = std::vector<join::JoinResultElement,_std::allocator<join::JoinResultElement>_>::end
                    ((vector<join::JoinResultElement,_std::allocator<join::JoinResultElement>_> *)
                     this);
  std::
  sort<__gnu_cxx::__normal_iterator<join::JoinResultElement*,std::vector<join::JoinResultElement,std::allocator<join::JoinResultElement>>>,common::vector_to_string[abi:cxx11](std::vector<join::JoinResultElement,std::allocator<join::JoinResultElement>>&)::__0>
            (iVar2._M_current,iVar3._M_current);
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  __end1 = std::vector<join::JoinResultElement,_std::allocator<join::JoinResultElement>_>::begin
                     ((vector<join::JoinResultElement,_std::allocator<join::JoinResultElement>_> *)
                      this);
  e.ted_value = (double)std::
                        vector<join::JoinResultElement,_std::allocator<join::JoinResultElement>_>::
                        end((vector<join::JoinResultElement,_std::allocator<join::JoinResultElement>_>
                             *)this);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<join::JoinResultElement_*,_std::vector<join::JoinResultElement,_std::allocator<join::JoinResultElement>_>_>
                                     *)&e.ted_value), bVar1) {
    pJVar4 = __gnu_cxx::
             __normal_iterator<join::JoinResultElement_*,_std::vector<join::JoinResultElement,_std::allocator<join::JoinResultElement>_>_>
             ::operator*(&__end1);
    uStack_58._0_4_ = pJVar4->tree_id_1;
    uStack_58._4_4_ = pJVar4->tree_id_2;
    e._0_8_ = pJVar4->ted_value;
    std::__cxx11::to_string(&local_138,(undefined4)uStack_58);
    std::operator+(&local_118,"{",&local_138);
    std::operator+(&local_f8,&local_118,",");
    std::__cxx11::to_string(&local_168,uStack_58._4_4_);
    std::operator+(&local_d8,&local_f8,&local_168);
    std::operator+(&local_b8,&local_d8,",");
    __val = lround((double)e._0_8_);
    std::__cxx11::to_string(&local_188,__val);
    std::operator+(&local_98,&local_b8,&local_188);
    std::operator+(&local_78,&local_98,"},");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_138);
    __gnu_cxx::
    __normal_iterator<join::JoinResultElement_*,_std::vector<join::JoinResultElement,_std::allocator<join::JoinResultElement>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::string::pop_back();
  return __return_storage_ptr__;
}

Assistant:

std::string vector_to_string(std::vector<join::JoinResultElement>& v) {
  // Sort the vector using lambda function implemented here.
  std::sort(v.begin(), v.end(), [](const join::JoinResultElement& a,
                                   const join::JoinResultElement& b){
    if (a.tree_id_1 < b.tree_id_1) {
      return true;
    } else if (a.tree_id_1 == b.tree_id_1) {
      if (a.tree_id_2 < b.tree_id_2) {
        return true;
      } else if (a.tree_id_2 == b.tree_id_2) {
        if (a.ted_value < b.ted_value) {
          return true;
        }
      }
    }
    return false;
  });
  // Convert vector to string.
  std::string s;
  for (auto e : v) {
    s += "{" + std::to_string(e.tree_id_1) + "," + std::to_string(e.tree_id_2)
        + "," + std::to_string(std::lround(e.ted_value)) + "},";
  }
  s.pop_back(); // Delete the last comma.
  return s;
}